

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintFanioNew(FILE *pFile,Abc_Ntk_t *pNtk,int fMffc)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  uint i;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint Addition;
  int iVar5;
  ulong uVar6;
  uint n;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  uint local_d4;
  int local_d0;
  int local_cc;
  char Buffer [100];
  
  local_d4 = 0;
  n = 0;
  local_d0 = 0;
  local_cc = 0;
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      if (fMffc == 0) {
        uVar7 = (pAVar4->vFanins).nSize;
        if (pNtk->ntkType == ABC_NTK_NETLIST) {
LAB_002a957e:
          pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray];
        }
        uVar3 = (pAVar4->vFanouts).nSize;
      }
      else {
        if ((pAVar4->vFanouts).nSize == 1) goto LAB_002a95b5;
        uVar7 = (pAVar4->vFanins).nSize;
        if (pNtk->ntkType == ABC_NTK_NETLIST) goto LAB_002a957e;
        uVar3 = Abc_NodeMffcSize(pAVar4);
      }
      local_d0 = local_d0 + uVar7;
      local_cc = local_cc + uVar3;
      if ((int)local_d4 <= (int)uVar7) {
        local_d4 = uVar7;
      }
      if ((int)n <= (int)uVar3) {
        n = uVar3;
      }
    }
LAB_002a95b5:
  }
  iVar5 = Abc_Base10Log(local_d4);
  uVar3 = iVar5 * 10 + 10;
  iVar5 = Abc_Base10Log(n);
  uVar7 = iVar5 * 10 + 10;
  if ((int)uVar7 < (int)uVar3) {
    uVar7 = uVar3;
  }
  uVar8 = (ulong)uVar7;
  p = Vec_IntStart(uVar7);
  p_00 = Vec_IntStart(uVar7);
  iVar5 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar5) {
      fwrite("The distribution of fanins and fanouts in the network:\n",0x37,1,(FILE *)pFile);
      fwrite("         Number   Nodes with fanin  Nodes with fanout\n",0x36,1,(FILE *)pFile);
      if ((int)uVar7 < 1) {
        uVar8 = 0;
      }
      uVar6 = 0;
      while( true ) {
        if (uVar8 == uVar6) break;
        piVar1 = p->pArray;
        if ((piVar1[uVar6] != 0) || (p_00->pArray[uVar6] != 0)) {
          if (uVar6 < 10) {
            fprintf((FILE *)pFile,"%15d : ",uVar6 & 0xffffffff);
          }
          else {
            iVar5 = (int)((uVar6 & 0xffffffff) / 10) * -10;
            dVar10 = (double)(int)((uVar6 & 0xffffffff) / 10);
            dVar9 = pow(10.0,dVar10);
            dVar10 = pow(10.0,dVar10);
            sprintf(Buffer,"%d - %d",(ulong)(uint)(((int)uVar6 + iVar5) * (int)dVar9),
                    (ulong)(((int)uVar6 + iVar5 + 1) * (int)dVar10 - 1));
            fprintf((FILE *)pFile,"%15s : ",Buffer);
          }
          if (piVar1[uVar6] == 0) {
            fwrite("              ",0xe,1,(FILE *)pFile);
          }
          else {
            fprintf((FILE *)pFile,"%12d  ");
          }
          fwrite("    ",4,1,(FILE *)pFile);
          if (p_00->pArray[uVar6] == 0) {
            fwrite("              ",0xe,1,(FILE *)pFile);
          }
          else {
            fprintf((FILE *)pFile,"%12d  ");
          }
          fputc(10,(FILE *)pFile);
        }
        uVar6 = uVar6 + 1;
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
      fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
              (double)local_d0 / (double)pNtk->nObjCounts[7],
              (double)local_cc / (double)pNtk->nObjCounts[7],(ulong)local_d4,(ulong)n);
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      if (fMffc == 0) {
        uVar3 = (pAVar4->vFanins).nSize;
        if (pNtk->ntkType == ABC_NTK_NETLIST) {
LAB_002a9668:
          pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray];
        }
        i = (pAVar4->vFanouts).nSize;
        Addition = extraout_EDX;
      }
      else {
        if ((pAVar4->vFanouts).nSize == 1) goto LAB_002a9738;
        uVar3 = (pAVar4->vFanins).nSize;
        if (pNtk->ntkType == ABC_NTK_NETLIST) goto LAB_002a9668;
        i = Abc_NodeMffcSize(pAVar4);
        Addition = extraout_EDX_00;
      }
      if ((int)uVar3 < 10) {
LAB_002a96ce:
        Vec_IntAddToEntry(p,uVar3,Addition);
        Addition = extraout_EDX_01;
      }
      else {
        if (uVar3 < 100) {
          uVar3 = (uint)(byte)((char)(((ushort)uVar3 & 0xff) / 10) + 10);
          goto LAB_002a96ce;
        }
        if (uVar3 < 1000) {
          Addition = (uVar3 & 0xffff) % 100;
          uVar2 = (short)((uVar3 & 0xffff) / 100) + 0x14;
LAB_002a96cb:
          uVar3 = (uint)uVar2;
          goto LAB_002a96ce;
        }
        if (uVar3 < 10000) {
          Addition = (uVar3 & 0xffff) % 1000;
          uVar2 = (short)((uVar3 & 0xffff) / 1000) + 0x1e;
          goto LAB_002a96cb;
        }
        if (uVar3 < 100000) {
          Addition = uVar3 % 10000;
          uVar3 = uVar3 / 10000 + 0x28;
          goto LAB_002a96ce;
        }
        if (uVar3 < 1000000) {
          Addition = uVar3 % 100000;
          uVar3 = uVar3 / 100000 + 0x32;
          goto LAB_002a96ce;
        }
        if (uVar3 < 10000000) {
          Addition = uVar3 % 1000000;
          uVar3 = uVar3 / 1000000 + 0x3c;
          goto LAB_002a96ce;
        }
      }
      if (9 < (int)i) {
        if (i < 100) {
          i = (uint)(byte)((char)(((ushort)i & 0xff) / 10) + 10);
        }
        else {
          if (i < 1000) {
            Addition = (i & 0xffff) % 100;
            uVar2 = (short)((i & 0xffff) / 100) + 0x14;
          }
          else {
            if (9999 < i) {
              if (i < 100000) {
                Addition = i % 10000;
                i = i / 10000 + 0x28;
              }
              else if (i < 1000000) {
                Addition = i % 100000;
                i = i / 100000 + 0x32;
              }
              else {
                if (9999999 < i) goto LAB_002a9738;
                Addition = i % 1000000;
                i = i / 1000000 + 0x3c;
              }
              goto LAB_002a972b;
            }
            Addition = (i & 0xffff) % 1000;
            uVar2 = (short)((i & 0xffff) / 1000) + 0x1e;
          }
          i = (uint)uVar2;
        }
      }
LAB_002a972b:
      Vec_IntAddToEntry(p_00,i,Addition);
    }
LAB_002a9738:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Abc_NtkPrintFanioNew( FILE * pFile, Abc_Ntk_t * pNtk, int fMffc )
{
    char Buffer[100];
    Abc_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    fprintf( pFile, "The distribution of fanins and fanouts in the network:\n" );
    fprintf( pFile, "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanins->pArray[k] );
        fprintf( pFile, "    " );
        if ( vFanouts->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanouts->pArray[k] );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
        nFaninsMax,  1.0*nFaninsAll/Abc_NtkNodeNum(pNtk),
        nFanoutsMax, 1.0*nFanoutsAll/Abc_NtkNodeNum(pNtk)  );
/*
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        printf( "%d ", Abc_ObjFanoutNum(pNode) );
    }
    printf( "\n" );
*/
}